

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O2

int replacePic(istream *in,ostream *output,path *replacementFile)

{
  pointer *ppuVar1;
  pointer *ppMVar2;
  ushort uVar3;
  uint uVar4;
  PicChunk *chunk_1;
  pointer pPVar5;
  ulong uVar6;
  Point PVar7;
  iterator iVar8;
  pointer __p;
  pointer pCVar9;
  pointer __result;
  pointer pCVar10;
  pointer pCVar11;
  size_t sVar12;
  int iVar13;
  _Tp_alloc_type *__alloc;
  size_t __n;
  iterator __begin1;
  Size newSize;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint32_t uVar19;
  uint uVar20;
  _Tp_alloc_type *p_Var21;
  pointer pCVar22;
  uint uVar23;
  ulong uVar24;
  size_t __n_00;
  pointer local_1e0;
  size_t local_1d8;
  vector<ChunkData,_std::allocator<ChunkData>_> local_1c8;
  pointer local_1b0;
  pointer local_1a8;
  ulong local_1a0;
  long local_198;
  Compressor compressor;
  Image chunk;
  Image replacement;
  PicHeader header;
  vector<PicChunk,_std::allocator<PicChunk>_> chunkEntries;
  ChunkHeader local_b0;
  unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  seen;
  ulong uVar14;
  
  header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator>>(in,&header);
  uVar24 = 0x400;
  uVar18 = 0x400;
  pPVar5 = header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    uVar17 = (uint)uVar18;
    uVar23 = (uint)uVar24;
    if (pPVar5 == header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
    uVar3 = pPVar5->x;
    uVar6 = (ulong)(uint)uVar3;
    if (uVar17 < uVar3) {
      uVar6 = uVar18;
    }
    if (0x40 < uVar3) {
      uVar18 = uVar6;
    }
    uVar3 = pPVar5->y;
    uVar6 = (ulong)(uint)uVar3;
    if (uVar23 < uVar3) {
      uVar6 = uVar24;
    }
    if (0x40 < uVar3) {
      uVar24 = uVar6;
    }
    pPVar5 = pPVar5 + 1;
  }
  printf("Using %dx%d chunks\n",uVar18,uVar24);
  seen._M_h._M_buckets = &seen._M_h._M_single_bucket;
  seen._M_h._M_bucket_count = 1;
  seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen._M_h._M_element_count = 0;
  seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen._M_h._M_rehash_policy._M_next_resize = 0;
  seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Compressor::Compressor(&compressor);
  Image::readPNG(&replacement,replacementFile);
  local_1c8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chunkEntries.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chunkEntries.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chunkEntries.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize
            (&header.chunks,
             (long)(((int)(uVar23 + replacement.size.height + -1) / (int)uVar23) *
                   ((int)(replacement.size.width + uVar17 + -1) / (int)uVar17)));
  local_1d8 = PicHeader::binSize(&header);
  uVar20 = 0;
  Image::Image(&chunk,(Size)0x0,(Color)0x0);
  local_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  local_1e0 = (pointer)0x0;
  __n_00 = 0;
  do {
    uVar4 = replacement.size.height - uVar20;
    if (uVar4 == 0 || replacement.size.height < (int)uVar20) {
      header.filesize = (uint32_t)local_1d8;
      PicHeader::write(&header,(int)output,in,__n_00);
      pCVar10 = local_1a8;
      for (; local_1e0 != pCVar10; local_1e0 = local_1e0 + 1) {
        std::ostream::seekp((long)output,local_1e0->offset);
        operator<<(output,&local_1e0->header);
        std::ostream::write((char *)output,
                            (long)(local_1e0->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      }
      std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
                (&chunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
      std::_Vector_base<PicChunk,_std::allocator<PicChunk>_>::~_Vector_base
                (&chunkEntries.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>);
      std::vector<ChunkData,_std::allocator<ChunkData>_>::~vector(&local_1c8);
      std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
                (&replacement.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
      Compressor::~Compressor(&compressor);
      std::
      _Hashtable<Image,_std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Image>,_image_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&seen._M_h);
      std::_Vector_base<PicChunk,_std::allocator<PicChunk>_>::~_Vector_base
                (&header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>);
      return 0;
    }
    uVar6 = (ulong)uVar4;
    if ((int)uVar23 < (int)uVar4) {
      uVar6 = uVar24;
    }
    __n_00 = (size_t)(int)__n_00;
    local_198 = __n_00 * 0xc + 8;
    iVar13 = 0;
    uVar16 = 0;
    while( true ) {
      if (replacement.size.width <= (int)uVar16) break;
      uVar14 = (ulong)(uint)(replacement.size.width + iVar13);
      if ((int)uVar17 < replacement.size.width + iVar13) {
        uVar14 = uVar18;
      }
      newSize = (Size)(uVar14 | uVar6 << 0x20);
      local_1a0 = uVar16;
      Image::fastResize(&chunk,newSize);
      Image::drawOnto(&replacement,&chunk,(Point)0x0,
                      (Point)(local_1a0 & 0xffffffff | (ulong)uVar20 << 0x20),newSize);
      PVar7 = shrinkChunk(&chunk);
      pPVar5 = header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = local_198;
      *(short *)((long)header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl
                       .super__Vector_impl_data._M_start + local_198 + -8) =
           (short)PVar7.x + (short)local_1a0;
      *(short *)((long)header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl
                       .super__Vector_impl_data._M_start + local_198 + -6) =
           (short)PVar7.y + (short)uVar20;
      iVar8 = std::
              _Hashtable<Image,_std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Image>,_image_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&seen._M_h,&chunk);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pCVar10 = (pointer)(ulong)(ushort)chunk.size.width;
        uVar16 = (ulong)(ushort)chunk.size.height;
        if (local_1a8 == local_1b0) {
          if ((long)local_1b0 - (long)local_1e0 == 0x7ffffffffffffff8) {
            local_1c8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
            super__Vector_impl_data._M_start = local_1e0;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          __p = (pointer)(((long)local_1b0 - (long)local_1e0) / 0x68);
          pCVar9 = __p;
          if (local_1b0 == local_1e0) {
            pCVar9 = (pointer)0x1;
          }
          __alloc = (_Tp_alloc_type *)((long)&(pCVar9->header).type + (long)&(__p->header).type);
          if ((_Tp_alloc_type *)0x13b13b13b13b13a < __alloc) {
            __alloc = (_Tp_alloc_type *)0x13b13b13b13b13b;
          }
          p_Var21 = (_Tp_alloc_type *)0x13b13b13b13b13b;
          if (!CARRY8((ulong)pCVar9,(ulong)__p)) {
            p_Var21 = __alloc;
          }
          local_1b0 = pCVar10;
          if (p_Var21 == (_Tp_alloc_type *)0x0) {
            __result = (pointer)0x0;
          }
          else {
            __result = (pointer)operator_new((long)p_Var21 * 0x68);
          }
          pCVar22 = local_1a8;
          ppuVar1 = &__result[(long)__p].data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = (pointer)0x0;
          ppuVar1[1] = (pointer)0x0;
          pCVar10 = __result + (long)__p;
          (pCVar10->header).h = 0;
          *(undefined2 *)&(pCVar10->header).field_0x42 = 0;
          (pCVar10->header).size = 0;
          *(undefined8 *)(&(pCVar10->header).h + 4) = 0;
          ppMVar2 = &__result[(long)__p].header.transparentMasks.
                     super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          *ppMVar2 = (pointer)0x0;
          ppMVar2[1] = (pointer)0x0;
          __result[(long)__p].header.transparentMasks.
          super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          __result[(long)__p].header.transparentMasks.
          super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          ppMVar2 = &__result[(long)__p].header.masks.
                     super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppMVar2 = (pointer)0x0;
          ppMVar2[1] = (pointer)0x0;
          *(undefined8 *)&__result[(long)__p].header = 0;
          __result[(long)__p].header.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(undefined8 *)&__result[(long)__p].offset = 0;
          pCVar10 = std::vector<ChunkData,_std::allocator<ChunkData>_>::_S_relocate
                              (local_1e0,local_1a8,__result,__alloc);
          pCVar11 = std::vector<ChunkData,_std::allocator<ChunkData>_>::_S_relocate
                              (pCVar22,pCVar22,pCVar10 + 1,__alloc);
          std::_Vector_base<ChunkData,_std::allocator<ChunkData>_>::_M_deallocate
                    ((_Vector_base<ChunkData,_std::allocator<ChunkData>_> *)local_1e0,__p,__n);
          pCVar22 = __result + (long)p_Var21;
          lVar15 = local_198;
          pCVar10 = local_1b0;
          local_1e0 = __result;
          local_1c8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pCVar22;
        }
        else {
          (local_1a8->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_1a8->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (local_1a8->header).h = 0;
          *(undefined2 *)&(local_1a8->header).field_0x42 = 0;
          (local_1a8->header).size = 0;
          (local_1a8->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_1a8->header).transparentMasks.
          super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          (local_1a8->header).alignmentWords = 0;
          (local_1a8->header).x = 0;
          (local_1a8->header).y = 0;
          (local_1a8->header).w = 0;
          (local_1a8->header).transparentMasks.
          super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          (local_1a8->header).transparentMasks.
          super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          *(undefined8 *)&local_1a8->offset = 0;
          (local_1a8->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_1a8->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(undefined8 *)&local_1a8->header = 0;
          (local_1a8->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pCVar11 = local_1a8 + 1;
          pCVar22 = local_1b0;
        }
        local_1c8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar11;
        Compressor::encodeChunk
                  (&local_b0,&compressor,&pCVar11[-1].data,&chunk,
                   (MaskRect)((long)pCVar10 << 0x20 | uVar16 << 0x30),(Point)0x0,header.isSwitch);
        uVar19 = (((int)local_1d8 + 0xf) / 0x10) * 0x10;
        local_1b0 = pCVar22;
        ChunkHeader::operator=(&pCVar11[-1].header,&local_b0);
        ChunkHeader::~ChunkHeader(&local_b0);
        pCVar11[-1].offset = uVar19;
        *(uint32_t *)((long)pPVar5 + lVar15 + -4) = uVar19;
        sVar12 = ChunkHeader::calcAlignmentGetBinSize(&pCVar11[-1].header);
        *(int *)((long)&pPVar5->x + lVar15) =
             ((int)sVar12 +
             *(int *)&pCVar11[-1].data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) -
             *(int *)&pCVar11[-1].data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_b0.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)((long)pPVar5 + lVar15 + -4);
        local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)chunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)chunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)chunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
        chunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        chunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        chunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        _Hashtable<Image,std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<Image>,image_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<Image,std::pair<unsigned_int,unsigned_int>>>
                  ((_Hashtable<Image,std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<Image>,image_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&seen,&local_b0);
        local_1a8 = pCVar11;
        std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
                  ((_Vector_base<Color,_std::allocator<Color>_> *)&local_b0.masks);
        local_1d8 = (size_t)(uVar19 + *(int *)((long)&pPVar5->x + lVar15));
      }
      else {
        *(undefined8 *)((long)pPVar5 + lVar15 + -4) =
             *(undefined8 *)
              ((long)iVar8.
                     super__Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
                     ._M_cur + 0x28);
      }
      uVar16 = (ulong)((int)local_1a0 + uVar17);
      local_198 = lVar15 + 0xc;
      iVar13 = iVar13 - uVar17;
      __n_00 = __n_00 + 1;
    }
    local_1c8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
    super__Vector_impl_data._M_start = local_1e0;
    uVar20 = uVar20 + uVar23;
  } while( true );
}

Assistant:

int replacePic(std::istream &in, std::ostream &output, const fs::path &replacementFile) {
	PicHeader header;
	in >> header;

	int CHUNK_WIDTH = 1024;
	int CHUNK_HEIGHT = 1024;

	for (const auto& chunk : header.chunks) {
		if (chunk.x > 64 && chunk.x < CHUNK_WIDTH) {
			CHUNK_WIDTH = chunk.x;
		}
		if (chunk.y > 64 && chunk.y < CHUNK_HEIGHT) {
			CHUNK_HEIGHT = chunk.y;
		}
	}

	printf("Using %dx%d chunks\n", CHUNK_WIDTH, CHUNK_HEIGHT);

	std::unordered_map<Image, std::pair<uint32_t, uint32_t>, image_hash> seen;

	Compressor compressor;
	Image replacement = Image::readPNG(replacementFile);
	struct ChunkData {
		ChunkHeader header;
		std::vector<uint8_t> data;
		uint32_t offset;
	};
	std::vector<ChunkData> data;
	std::vector<PicChunk> chunkEntries;
	Size sizeInChunks = {(replacement.size.width + CHUNK_WIDTH - 1) / CHUNK_WIDTH, (replacement.size.height + CHUNK_HEIGHT - 1) / CHUNK_HEIGHT};
	header.chunks.resize(sizeInChunks.area());
	int pos = header.binSize();
	Image chunk;
	int headerIdx = 0;
	for (int y1 = 0; y1 < replacement.size.height; y1 += CHUNK_HEIGHT) {
		int height = std::min(replacement.size.height - y1, CHUNK_HEIGHT);
		for (int x1 = 0; x1 < replacement.size.width; x1 += CHUNK_WIDTH) {
			int width = std::min(replacement.size.width - x1, CHUNK_WIDTH);
			chunk.fastResize({width, height});
			replacement.drawOnto(chunk, {0, 0}, {x1, y1}, {width, height});
			Point shrink = shrinkChunk(chunk);

			auto& headerEntry = header.chunks[headerIdx];
			headerIdx++;
			headerEntry.x = x1 + shrink.x;
			headerEntry.y = y1 + shrink.y;

			auto found = seen.find(chunk);
			if (found == seen.end()) {
				pos = (pos + 15) / 16 * 16;
				MaskRect bounds = {0, 0, static_cast<uint16_t>(chunk.size.width), static_cast<uint16_t>(chunk.size.height)};
				data.emplace_back();
				auto& chunkEntry = data.back();
				chunkEntry.header = compressor.encodeChunk(chunkEntry.data, chunk, bounds, {0, 0}, header.isSwitch);
				chunkEntry.offset = pos;

				headerEntry.offset = pos;
				headerEntry.size = chunkEntry.header.calcAlignmentGetBinSize() + chunkEntry.data.size();
				seen.insert(std::make_pair(std::move(chunk), std::make_pair(headerEntry.offset, headerEntry.size)));
				pos += headerEntry.size;
			} else {
				headerEntry.offset = found->second.first;
				headerEntry.size = found->second.second;
			}
		}
	}

	header.filesize = pos;
	header.write(output, in);
	for (auto& chunk : data) {
		output.seekp(chunk.offset, output.beg);
		output << chunk.header;
		output.write(reinterpret_cast<char*>(chunk.data.data()), chunk.data.size());
	}
	return 0;
}